

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_dec.c
# Opt level: O0

int jpc_ppxstab_insert(jpc_ppxstab_t *tab,jpc_ppxstabent_t *ent)

{
  int iVar1;
  int iVar2;
  int local_28;
  int i;
  int inspt;
  jpc_ppxstabent_t *ent_local;
  jpc_ppxstab_t *tab_local;
  
  local_28 = 0;
  while ((iVar1 = local_28, local_28 < tab->numents && (tab->ents[local_28]->ind <= ent->ind))) {
    local_28 = local_28 + 1;
  }
  if ((tab->numents < tab->maxents) ||
     (iVar2 = jpc_ppxstab_grow(tab,tab->maxents + 0x80), iVar2 == 0)) {
    for (local_28 = tab->numents; iVar1 < local_28; local_28 = local_28 + -1) {
      tab->ents[local_28] = tab->ents[local_28 + -1];
    }
    tab->ents[local_28] = ent;
    tab->numents = tab->numents + 1;
    tab_local._4_4_ = 0;
  }
  else {
    tab_local._4_4_ = -1;
  }
  return tab_local._4_4_;
}

Assistant:

static int jpc_ppxstab_insert(jpc_ppxstab_t *tab, jpc_ppxstabent_t *ent)
{
	int inspt;
	int i;

	for (i = 0; i < tab->numents; ++i) {
		if (tab->ents[i]->ind > ent->ind) {
			break;
		}
	}
	inspt = i;

	if (tab->numents >= tab->maxents) {
		if (jpc_ppxstab_grow(tab, tab->maxents + 128)) {
			return -1;
		}
	}

	for (i = tab->numents; i > inspt; --i) {
		tab->ents[i] = tab->ents[i - 1];
	}
	tab->ents[i] = ent;
	++tab->numents;

	return 0;
}